

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

Statement * __thiscall hdc::Parser::parse_for_statement(Parser *this)

{
  bool bVar1;
  Expression *e1;
  Expression *pEVar2;
  CompoundStatement *pCVar3;
  ForStatement *this_00;
  Expression *e3;
  
  expect(this,TK_FOR);
  e1 = parse_assignment_expression(this);
  bVar1 = match(this,TK_IN);
  if (bVar1) {
    pEVar2 = parse_assignment_expression(this);
    expect(this,TK_COLON);
    expect(this,TK_NEWLINE);
    expect(this,TK_BEGIN);
    pCVar3 = parse_statements(this);
    expect(this,TK_END);
    this_00 = (ForStatement *)operator_new(0x38);
    ForEachStatement::ForEachStatement((ForEachStatement *)this_00,e1,pEVar2,pCVar3);
  }
  else {
    expect(this,TK_SEMICOLON);
    pEVar2 = parse_assignment_expression(this);
    expect(this,TK_SEMICOLON);
    e3 = parse_assignment_expression(this);
    expect(this,TK_COLON);
    expect(this,TK_NEWLINE);
    expect(this,TK_BEGIN);
    pCVar3 = parse_statements(this);
    expect(this,TK_END);
    this_00 = (ForStatement *)operator_new(0x40);
    ForStatement::ForStatement(this_00,e1,pEVar2,e3,pCVar3);
  }
  return &this_00->super_Statement;
}

Assistant:

Statement* Parser::parse_for_statement() {
    Statement* for_stmt = nullptr;
    Expression* e1 = nullptr;
    Expression* e2 = nullptr;
    Expression* e3 = nullptr;
    CompoundStatement* statements = nullptr;

    expect(TK_FOR);
    e1 = parse_expression();

    if (match(TK_IN)) {
        e2 = parse_expression();

        expect(TK_COLON);
        expect(TK_NEWLINE);
        expect(TK_BEGIN);
        statements = parse_statements();
        expect(TK_END);

        for_stmt = new ForEachStatement(e1, e2, statements);
    } else {
        expect(TK_SEMICOLON);
        e2 = parse_expression();
        expect(TK_SEMICOLON);
        e3 = parse_expression();

        expect(TK_COLON);
        expect(TK_NEWLINE);
        expect(TK_BEGIN);
        statements = parse_statements();
        expect(TK_END);

        for_stmt = new ForStatement(e1, e2, e3, statements);
    }

    return for_stmt;
}